

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O2

ConsumeResult * __thiscall
binlog::Session::consume<std::ostream>
          (ConsumeResult *__return_storage_ptr__,Session *this,
          basic_ostream<char,_std::char_traits<char>_> *out)

{
  pointer pcVar1;
  __shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *entry;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  __normal_iterator<std::shared_ptr<binlog::Session::Channel>_*,_std::vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>_>
  __first;
  pointer pcVar7;
  pointer pcVar8;
  size_t sVar9;
  shared_ptr<binlog::Session::Channel> *channelptr;
  __shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar10;
  size_t local_78;
  QueueReader reader;
  ReadResult data;
  
  std::mutex::lock(&this->_mutex);
  __return_storage_ptr__->channelsPolled = 0;
  __return_storage_ptr__->channelsRemoved = 0;
  __return_storage_ptr__->bytesConsumed = 0;
  __return_storage_ptr__->totalBytesConsumed = 0;
  if (this->_consumeClockSync == true) {
    std::ostream::write((char *)out,
                        (long)((this->_clockSync)._vector.
                               super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start + 0x18));
    pcVar7 = (this->_clockSync)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish +
             (-0x18 - (long)(this->_clockSync)._vector.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    __return_storage_ptr__->bytesConsumed = (size_t)pcVar7;
    this->_consumeClockSync = false;
  }
  else {
    pcVar7 = (pointer)0x0;
  }
  pcVar1 = (this->_sources)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar8 = (this->_sources)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = (-(long)pcVar1 - this->_sourcesConsumePos) + -0x18;
  std::ostream::write((char *)out,(long)(pcVar1 + this->_sourcesConsumePos + 0x18));
  this->_sourcesConsumePos = (streamsize)(pcVar8 + this->_sourcesConsumePos + lVar4);
  pcVar8 = pcVar8 + (long)(pcVar7 + lVar4);
  __return_storage_ptr__->bytesConsumed = (size_t)pcVar8;
  this_00 = &((this->_channels).
              super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>;
  p_Var2 = &((this->_channels).
             super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>;
  sVar9 = 1;
  local_78 = 0;
  for (; this_00 != p_Var2; this_00 = this_00 + 1) {
    p_Var3 = (this_00->_M_refcount)._M_pi;
    if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar10 = false;
    }
    else {
      bVar10 = p_Var3->_M_use_count == 1;
    }
    entry = this_00->_M_ptr;
    reader._queue =
         (Queue *)((entry->_queue)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                   _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x10);
    reader._readEnd = 0;
    detail::QueueReader::beginRead(&data,&reader);
    if (data.size2 + data.size1 != 0) {
      (entry->writerProp).batchSize = data.size2 + data.size1;
      sVar5 = consumeSpecialEntry<binlog::WriterProp,std::ostream>(this,&entry->writerProp,out);
      __return_storage_ptr__->bytesConsumed = (size_t)(pcVar8 + sVar5);
      std::ostream::write((char *)out,(long)data.buffer1);
      if (data.size2 == 0) {
        sVar6 = 0;
      }
      else {
        std::ostream::write((char *)out,(long)data.buffer2);
        sVar6 = data.size2;
      }
      ((reader._queue)->readIndex).super___atomic_base<unsigned_long>._M_i = reader._readEnd;
      pcVar8 = pcVar8 + sVar5 + sVar6 + data.size1;
      __return_storage_ptr__->bytesConsumed = (size_t)pcVar8;
    }
    if (bVar10) {
      std::__shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>::reset(this_00);
      local_78 = local_78 + 1;
      __return_storage_ptr__->channelsRemoved = local_78;
    }
    __return_storage_ptr__->channelsPolled = sVar9;
    sVar9 = sVar9 + 1;
  }
  __first = std::
            __remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<binlog::Session::Channel>*,std::vector<std::shared_ptr<binlog::Session::Channel>,std::allocator<std::shared_ptr<binlog::Session::Channel>>>>,__gnu_cxx::__ops::_Iter_pred<binlog::Session::consume<std::ostream>(std::ostream&)::_lambda(std::shared_ptr<binlog::Session::Channel>const&)_1_>>
                      ((this->_channels).
                       super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->_channels).
                       super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
  ::erase(&this->_channels,(const_iterator)__first._M_current,
          (this->_channels).
          super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  sVar9 = this->_totalConsumedBytes;
  this->_totalConsumedBytes = (size_t)(pcVar8 + sVar9);
  __return_storage_ptr__->totalBytesConsumed = (size_t)(pcVar8 + sVar9);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return __return_storage_ptr__;
}

Assistant:

Session::ConsumeResult Session::consume(OutputStream& out)
{
  // This lock:
  //  - Ensures only a single consumer is running at a time
  //  - Ensures safe read of _channels
  //  - Ensures safe read of Channel::writerProp (written by setChannelWriterName)
  //  - Ensures safe read of _sources
  //  - Ensures no new EventSource can be added to _sources while consuming
  //
  // Without this lock, the following becomes possible:
  //  - Consumer starts, consumes _sources
  //  - Producer1 adds a new elem (ES123) to sources
  //  - Producer2 finds that ES123 is already added
  //  - Producer2 adds a new event using ES123
  //  - Consumer continues, consumes the event added by Producer2
  // This would result in a corrupt stream, as the event source
  // must precede every event referencing it. This is solved by the lock
  // that blocks P1 *and* P2 while adding ES123.
  std::lock_guard<std::mutex> lock(_mutex);

  ConsumeResult result;

  // add a clock sync if not yet added
  if (_consumeClockSync)
  {
    out.write(_clockSync.data(), _clockSync.ssize());
    result.bytesConsumed += std::size_t(_clockSync.ssize());
    _consumeClockSync = false;
  }

  // consume event sources before events
  const std::streamsize sourceWriteSize = _sources.ssize() - _sourcesConsumePos;
  out.write(_sources.data() + _sourcesConsumePos, sourceWriteSize);
  _sourcesConsumePos += sourceWriteSize;
  result.bytesConsumed += std::size_t(sourceWriteSize);

  // consume some events
  for (std::shared_ptr<Channel>& channelptr : _channels)
  {
    // Important to check if channel is closed before beginRead,
    // otherwise the following race becomes possible:
    //  - Consumer finds queue is empty
    //  - Producer adds data
    //  - Producer closes the queue
    //  - Consumer finds queue is closed, removes it -> data loss
    const bool isClosed = (channelptr.use_count() == 1);

    Channel& ch = *channelptr;

    detail::QueueReader reader(ch.queue());
    const detail::QueueReader::ReadResult data = reader.beginRead();
    if (data.size())
    {
      // consume writerProp entry
      ch.writerProp.batchSize = data.size();
      result.bytesConsumed += consumeSpecialEntry(ch.writerProp, out);

      // consume queue data
      out.write(data.buffer1, std::streamsize(data.size1));
      if (data.size2)
      {
        // data wraps around the end of the queue, consume the second half as well
        out.write(data.buffer2, std::streamsize(data.size2));
      }

      reader.endRead();
      result.bytesConsumed += data.size();
    }

    if (isClosed)
    {
      // queue is empty and closed, remove it
      channelptr.reset();
      result.channelsRemoved++;
    }

    result.channelsPolled++;
  }

  // remove empty and closed channels
  _channels.erase(
    std::remove_if(
      _channels.begin(), _channels.end(),
      [](const std::shared_ptr<Channel>& channelptr) { return !channelptr; }
    ),
    _channels.end()
  );

  _totalConsumedBytes += result.bytesConsumed;
  result.totalBytesConsumed = _totalConsumedBytes;

  return result;
}